

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::SetSideOrder
          (TPZCompElH1<pzshape::TPZShapePrism> *this,int side,int order)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ostream *this_00;
  long *plVar5;
  long lVar6;
  TPZCompMesh *pTVar7;
  int64_t iVar8;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> equal;
  TPZGeoElSide local_108;
  TPZStack<TPZCompElSide,_10> local_f0;
  
  if ((0x14 < (uint)side) || (order < 1 && 5 < side)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZIntelGen::SetSideOrder. Bad paramenter side ",0x2f);
    this_00 = (ostream *)std::ostream::operator<<(&std::cerr,side);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," order ",7);
    plVar5 = (long *)std::ostream::operator<<(this_00,order);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElH1.cpp"
               ,0xa8);
  }
  if ((5 < side) && ((this->fConnectIndexes).super_TPZVec<long>.fStore[side] != -1)) {
    iVar2 = (this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
            super_TPZInterpolationSpace.fPreferredOrder;
    lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa0))(this,0x14);
    if (lVar6 != -1) {
      iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x338))(this,0x14);
    }
    lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,side);
    if ((uint)*(byte *)(lVar6 + 0x14) != order) {
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0xa0))(this,side);
      *(char *)(lVar6 + 0x14) = (char)order;
      uVar1 = *(undefined8 *)(lVar6 + 8);
      plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                              super_TPZInterpolatedElement.
                                              super_TPZInterpolationSpace.super_TPZCompEl + 0xb8))
                                 (this);
      if (plVar5 == (long *)0x0) {
        uVar3 = 1;
      }
      else {
        uVar3 = (**(code **)(*plVar5 + 0x78))(plVar5);
      }
      iVar4 = pzshape::TPZShapePrism::NConnectShapeF(side,order);
      *(int *)(lVar6 + 0x18) = iVar4;
      if (0xff < uVar3) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzconnect.h"
                   ,0xc6);
      }
      *(char *)(lVar6 + 0x15) = (char)uVar3;
      pTVar7 = TPZCompEl::Mesh((TPZCompEl *)this);
      TPZBlock::Set(&pTVar7->fBlock,(int)uVar1,iVar4 * uVar3,-1);
      local_108.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
      local_108.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
      lVar6 = 0x28;
      do {
        *(undefined8 *)
         ((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar6 + -0x28) = 0;
        *(undefined4 *)
         ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                  (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                 super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar6) = 0xffffffff;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 200);
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
           local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
           (_func_int **)&PTR__TPZManVector_01842198;
      local_108.fSide = side;
      TPZGeoElSide::EqualLevelCompElementList(&local_108,&local_f0,1,0);
      if (0 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements)
      {
        lVar6 = 0;
        iVar8 = local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements;
        do {
          plVar5 = (long *)__dynamic_cast(*(undefined8 *)
                                           ((long)&(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                                                    super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar6
                                           ),&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,
                                          0);
          (**(code **)(*plVar5 + 0x270))(plVar5);
          lVar6 = lVar6 + 0x10;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore ==
          local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc) {
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore =
             (TPZCompElSide *)0x0;
      }
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
      local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
           (_func_int **)&PTR__TPZVec_0183b970;
      if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
          (TPZCompElSide *)0x0) {
        operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>
                          .fStore);
      }
    }
    lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa0))(this,0x14);
    iVar4 = iVar2;
    if (lVar6 != -1) {
      iVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x338))(this,0x14);
    }
    if (iVar4 != iVar2) {
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x270))(this);
    }
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::SetSideOrder(int side, int order) {
	if(side<0 || side >= TSHAPE::NSides || (side >= TSHAPE::NCornerNodes && order <1)) {
		PZError << "TPZIntelGen::SetSideOrder. Bad paramenter side " << side << " order " << order << std::endl;
		DebugStop();
#ifdef PZ_LOG
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Bad side or order " << side << " order " << order;
		LOGPZ_ERROR(logger,sout.str())
#endif
		return;
	}
	if(side>= TSHAPE::NCornerNodes) {
		if(fConnectIndexes[side] == -1) return;
        int prevorder = this->fPreferredOrder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            prevorder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		TPZConnect &c = this->Connect(side);
        int previousconnectorder = c.Order();
        if (order != previousconnectorder)
        {
            c.SetOrder(order,this->ConnectIndex(side));
            int64_t seqnum = c.SequenceNumber();
            int nvar = 1;
            TPZMaterial * mat = this->Material();
            if(mat) nvar = mat->NStateVariables();
            int nshape = TSHAPE::NConnectShapeF(side, order);
            c.SetNShape(nshape);
            c.SetNState(nvar);
            this->Mesh()->Block().Set(seqnum,nshape*nvar);
            TPZGeoElSide gelside(this->Reference(),side);
            TPZStack<TPZCompElSide> equal;
            gelside.EqualLevelCompElementList(equal, 1, 0);
            int64_t neq = equal.size();
            for (int64_t eq=0; eq<neq; eq++) {
                TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement*>(equal[eq].Element());
                intel->AdjustIntegrationRule();
            }
        }
        
        int neworder = prevorder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            neworder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		if(neworder != prevorder) {
            this->AdjustIntegrationRule();
		}
	}
}